

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::NumberStringBuilder::containsField(NumberStringBuilder *this,Field field)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  ulong uVar5;
  
  uVar1 = this->fLength;
  if ((this->fUsingHeap & 1U) == 0) {
    pVVar4 = &this->fFields;
  }
  else {
    pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
  }
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar3 == uVar5) break;
    uVar2 = uVar5 + 1;
  } while (*(Field *)((long)pVVar4 + uVar5 * 4 + (long)this->fZero * 4) != field);
  return (long)uVar5 < (long)(int)uVar1;
}

Assistant:

bool NumberStringBuilder::containsField(Field field) const {
    for (int32_t i = 0; i < fLength; i++) {
        if (field == fieldAt(i)) {
            return true;
        }
    }
    return false;
}